

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::BlockEventListControl::Event>::
emplaceRealloc<slang::ast::BlockEventListControl::Event>
          (SmallVectorBase<slang::ast::BlockEventListControl::Event> *this,pointer pos,Event *args)

{
  size_type sVar1;
  undefined7 uVar2;
  size_type sVar3;
  size_type capacity;
  iterator pEVar4;
  Event *__result;
  Event *pEVar5;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Event *args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::BlockEventListControl::Event> *this_local;
  
  sVar1 = this->len;
  sVar3 = max_size(this);
  if (sVar1 == sVar3) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pEVar4 = begin(this);
  __result = (Event *)slang::detail::allocArray(capacity,0x10);
  pEVar5 = __result + ((long)pos - (long)pEVar4 >> 4);
  pEVar5->target = args->target;
  uVar2 = *(undefined7 *)&args->field_0x9;
  pEVar5->isBegin = args->isBegin;
  *(undefined7 *)&pEVar5->field_0x9 = uVar2;
  pEVar4 = end(this);
  if (pos == pEVar4) {
    __first = begin(this);
    pEVar4 = end(this);
    std::
    uninitialized_move<slang::ast::BlockEventListControl::Event*,slang::ast::BlockEventListControl::Event*>
              (__first,pEVar4,__result);
  }
  else {
    pEVar4 = begin(this);
    std::
    uninitialized_move<slang::ast::BlockEventListControl::Event*,slang::ast::BlockEventListControl::Event*>
              (pEVar4,pos,__result);
    pEVar4 = end(this);
    std::
    uninitialized_move<slang::ast::BlockEventListControl::Event*,slang::ast::BlockEventListControl::Event*>
              (pos,pEVar4,pEVar5 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pEVar4);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pEVar5;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}